

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_rwkv_wkv6(ggml_context *ctx,ggml_tensor *k,ggml_tensor *v,ggml_tensor *r,ggml_tensor *tf,
              ggml_tensor *td,ggml_tensor *state)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bool _Var5;
  int64_t iVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *result;
  int64_t ne [4];
  int64_t n_seqs;
  int64_t n_tokens;
  int64_t H;
  int64_t S;
  int in_stack_ffffffffffffff78;
  ggml_type in_stack_ffffffffffffff7c;
  ggml_context *in_stack_ffffffffffffff80;
  
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x152cca);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x127c,"GGML_ASSERT(%s) failed","ggml_is_contiguous(k)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x152cf9);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x127d,"GGML_ASSERT(%s) failed","ggml_is_contiguous(v)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x152d28);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x127e,"GGML_ASSERT(%s) failed","ggml_is_contiguous(r)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x152d57);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x127f,"GGML_ASSERT(%s) failed","ggml_is_contiguous(tf)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x152d86);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x1280,"GGML_ASSERT(%s) failed","ggml_is_contiguous(td)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x152db8);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x1281,"GGML_ASSERT(%s) failed","ggml_is_contiguous(state)");
  }
  lVar1 = in_RSI->ne[0];
  lVar2 = in_RSI->ne[1];
  lVar3 = in_RSI->ne[2];
  lVar4 = result->ne[1];
  if (((in_RDX->ne[0] != lVar1) || (in_RDX->ne[1] != lVar2)) || (in_RDX->ne[2] != lVar3)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x1288,"GGML_ASSERT(%s) failed",
               "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens");
  }
  if (((in_RCX->ne[0] == lVar1) && (in_RCX->ne[1] == lVar2)) && (in_RCX->ne[2] == lVar3)) {
    if (((in_R9->ne[0] == lVar1) && (in_R9->ne[1] == lVar2)) && (in_R9->ne[2] == lVar3)) {
      iVar6 = ggml_nelements(result);
      if (iVar6 != lVar1 * lVar1 * lVar2 * lVar4) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
                   ,0x128b,"GGML_ASSERT(%s) failed","ggml_nelements(state) == S * S * H * n_seqs");
      }
      pgVar7 = ggml_new_tensor(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                               in_stack_ffffffffffffff78,(int64_t *)0x152fa8);
      pgVar7->op = GGML_OP_RWKV_WKV6;
      pgVar7->src[0] = in_RSI;
      pgVar7->src[1] = in_RDX;
      pgVar7->src[2] = in_RCX;
      pgVar7->src[3] = in_R8;
      pgVar7->src[4] = in_R9;
      pgVar7->src[5] = result;
      return pgVar7;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x128a,"GGML_ASSERT(%s) failed",
               "td->ne[0] == S && td->ne[1] == H && td->ne[2] == n_tokens");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             0x1289,"GGML_ASSERT(%s) failed",
             "r->ne[0] == S && r->ne[1] == H && r->ne[2] == n_tokens");
}

Assistant:

struct ggml_tensor * ggml_rwkv_wkv6(
        struct ggml_context * ctx,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * r,
        struct ggml_tensor  * tf,
        struct ggml_tensor  * td,
        struct ggml_tensor  * state) {
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(r));
    GGML_ASSERT(ggml_is_contiguous(tf));
    GGML_ASSERT(ggml_is_contiguous(td));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(r->ne[0] == S && r->ne[1] == H && r->ne[2] == n_tokens);
        GGML_ASSERT(td->ne[0] == S && td->ne[1] == H && td->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_RWKV_WKV6;
    result->src[0] = k;
    result->src[1] = v;
    result->src[2] = r;
    result->src[3] = tf;
    result->src[4] = td;
    result->src[5] = state;

    return result;
}